

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O2

State * LiteScript::State::Load(State *__return_storage_ptr__,istream *stream,Memory *memory)

{
  vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
  *this;
  vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
  *pvVar1;
  vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_> *this_00;
  pointer pvVar2;
  pointer paVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  undefined1 local_98 [80];
  Variable *local_48;
  Variable local_40;
  
  State(__return_storage_ptr__,memory);
  uVar4 = IStreamer::Read<unsigned_int>(stream);
  __return_storage_ptr__->instr_index = uVar4;
  uVar4 = IStreamer::Read<unsigned_int>(stream);
  __return_storage_ptr__->line_num = uVar4;
  local_48 = &__return_storage_ptr__->nsp_global;
  Variable::~Variable(local_48);
  uVar4 = IStreamer::Read<unsigned_int>(stream);
  Memory::GetVariable((Nullable<LiteScript::Variable> *)local_98,memory,uVar4);
  Variable::Variable(local_48,(Variable *)local_98);
  Nullable<LiteScript::Variable>::Nullify((Nullable<LiteScript::Variable> *)local_98);
  this = &__return_storage_ptr__->args_tmp;
  std::
  vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
  ::clear(this);
  uVar4 = IStreamer::Read<unsigned_int>(stream);
  for (uVar8 = 0; uVar8 != uVar4; uVar8 = uVar8 + 1) {
    local_98._0_4_ = 0;
    local_98._4_4_ = 0;
    local_98._8_8_ = (uint *)0x0;
    local_98[0x10] = '\0';
    local_98[0x11] = '\0';
    local_98[0x12] = '\0';
    local_98[0x13] = '\0';
    local_98[0x14] = '\0';
    local_98[0x15] = '\0';
    local_98[0x16] = '\0';
    local_98[0x17] = '\0';
    std::
    vector<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>,std::allocator<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>>>
    ::emplace_back<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>>
              ((vector<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>,std::allocator<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>>>
                *)this,(vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)
                       local_98);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector
              ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_98);
    uVar5 = IStreamer::Read<unsigned_int>(stream);
    while (bVar10 = uVar5 != 0, uVar5 = uVar5 - 1, bVar10) {
      pvVar2 = (this->
               super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar6 = IStreamer::Read<unsigned_int>(stream);
      Memory::GetVariable((Nullable<LiteScript::Variable> *)local_98,memory,uVar6);
      Variable::Variable(&local_40,(Variable *)local_98);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
      emplace_back<LiteScript::Variable>(pvVar2 + uVar8,&local_40);
      Variable::~Variable(&local_40);
      Nullable<LiteScript::Variable>::Nullify((Nullable<LiteScript::Variable> *)local_98);
    }
  }
  std::
  vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
  ::clear(this);
  uVar4 = IStreamer::Read<unsigned_int>(stream);
  for (uVar8 = 0; uVar8 != uVar4; uVar8 = uVar8 + 1) {
    local_98._0_4_ = 0;
    local_98._4_4_ = 0;
    local_98._8_8_ = (uint *)0x0;
    local_98[0x10] = '\0';
    local_98[0x11] = '\0';
    local_98[0x12] = '\0';
    local_98[0x13] = '\0';
    local_98[0x14] = '\0';
    local_98[0x15] = '\0';
    local_98[0x16] = '\0';
    local_98[0x17] = '\0';
    std::
    vector<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>,std::allocator<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>>>
    ::emplace_back<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>>
              ((vector<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>,std::allocator<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>>>
                *)&__return_storage_ptr__->args_def,
               (vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_98);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector
              ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_98);
    uVar5 = IStreamer::Read<unsigned_int>(stream);
    while (bVar10 = uVar5 != 0, uVar5 = uVar5 - 1, bVar10) {
      pvVar2 = (__return_storage_ptr__->args_def).
               super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = IStreamer::Read<unsigned_int>(stream);
      Memory::GetVariable((Nullable<LiteScript::Variable> *)local_98,memory,uVar6);
      Variable::Variable(&local_40,(Variable *)local_98);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
      emplace_back<LiteScript::Variable>(pvVar2 + uVar8,&local_40);
      Variable::~Variable(&local_40);
      Nullable<LiteScript::Variable>::Nullify((Nullable<LiteScript::Variable> *)local_98);
    }
  }
  pvVar1 = &__return_storage_ptr__->ths;
  std::
  vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
  ::clear(pvVar1);
  uVar4 = IStreamer::Read<unsigned_int>(stream);
  while (bVar10 = uVar4 != 0, uVar4 = uVar4 - 1, bVar10) {
    iVar7 = std::istream::get();
    if (iVar7 == 0) {
      local_98[0x10] = true;
      local_98._24_8_ = local_98 + 0x10;
      std::
      vector<LiteScript::Nullable<LiteScript::Variable>,std::allocator<LiteScript::Nullable<LiteScript::Variable>>>
      ::emplace_back<LiteScript::Nullable<LiteScript::Variable>>
                ((vector<LiteScript::Nullable<LiteScript::Variable>,std::allocator<LiteScript::Nullable<LiteScript::Variable>>>
                  *)pvVar1,(Nullable<LiteScript::Variable> *)local_98);
    }
    else {
      uVar5 = IStreamer::Read<unsigned_int>(stream);
      Memory::GetVariable((Nullable<LiteScript::Variable> *)local_98,memory,uVar5);
      std::
      vector<LiteScript::Nullable<LiteScript::Variable>,std::allocator<LiteScript::Nullable<LiteScript::Variable>>>
      ::emplace_back<LiteScript::Nullable<LiteScript::Variable>>
                ((vector<LiteScript::Nullable<LiteScript::Variable>,std::allocator<LiteScript::Nullable<LiteScript::Variable>>>
                  *)pvVar1,(Nullable<LiteScript::Variable> *)local_98);
    }
    Nullable<LiteScript::Variable>::Nullify((Nullable<LiteScript::Variable> *)local_98);
  }
  pvVar1 = &__return_storage_ptr__->rets;
  std::
  vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
  ::clear(pvVar1);
  uVar4 = IStreamer::Read<unsigned_int>(stream);
  while (bVar10 = uVar4 != 0, uVar4 = uVar4 - 1, bVar10) {
    iVar7 = std::istream::get();
    if (iVar7 == 0) {
      local_98[0x10] = true;
      local_98._24_8_ = local_98 + 0x10;
      std::
      vector<LiteScript::Nullable<LiteScript::Variable>,std::allocator<LiteScript::Nullable<LiteScript::Variable>>>
      ::emplace_back<LiteScript::Nullable<LiteScript::Variable>>
                ((vector<LiteScript::Nullable<LiteScript::Variable>,std::allocator<LiteScript::Nullable<LiteScript::Variable>>>
                  *)pvVar1,(Nullable<LiteScript::Variable> *)local_98);
    }
    else {
      uVar5 = IStreamer::Read<unsigned_int>(stream);
      Memory::GetVariable((Nullable<LiteScript::Variable> *)local_98,memory,uVar5);
      std::
      vector<LiteScript::Nullable<LiteScript::Variable>,std::allocator<LiteScript::Nullable<LiteScript::Variable>>>
      ::emplace_back<LiteScript::Nullable<LiteScript::Variable>>
                ((vector<LiteScript::Nullable<LiteScript::Variable>,std::allocator<LiteScript::Nullable<LiteScript::Variable>>>
                  *)pvVar1,(Nullable<LiteScript::Variable> *)local_98);
    }
    Nullable<LiteScript::Variable>::Nullify((Nullable<LiteScript::Variable> *)local_98);
  }
  std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::clear
            (&__return_storage_ptr__->op_lifo);
  uVar4 = IStreamer::Read<unsigned_int>(stream);
  while (bVar10 = uVar4 != 0, uVar4 = uVar4 - 1, bVar10) {
    uVar5 = IStreamer::Read<unsigned_int>(stream);
    Memory::GetVariable((Nullable<LiteScript::Variable> *)local_98,memory,uVar5);
    Variable::Variable(&local_40,(Variable *)local_98);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
    emplace_back<LiteScript::Variable>(&__return_storage_ptr__->op_lifo,&local_40);
    Variable::~Variable(&local_40);
    Nullable<LiteScript::Variable>::Nullify((Nullable<LiteScript::Variable> *)local_98);
  }
  paVar3 = (__return_storage_ptr__->call_lifo).
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((__return_storage_ptr__->call_lifo).
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != paVar3) {
    (__return_storage_ptr__->call_lifo).
    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = paVar3;
  }
  uVar4 = IStreamer::Read<unsigned_int>(stream);
  while (bVar10 = uVar4 != 0, uVar4 = uVar4 - 1, bVar10) {
    uVar5 = IStreamer::Read<unsigned_int>(stream);
    local_98._0_4_ = uVar5;
    uVar5 = IStreamer::Read<unsigned_int>(stream);
    local_98._4_4_ = uVar5;
    std::vector<std::array<unsigned_int,2ul>,std::allocator<std::array<unsigned_int,2ul>>>::
    emplace_back<std::array<unsigned_int,2ul>>
              ((vector<std::array<unsigned_int,2ul>,std::allocator<std::array<unsigned_int,2ul>>> *)
               &__return_storage_ptr__->call_lifo,(array<unsigned_int,_2UL> *)local_98);
  }
  this_00 = &__return_storage_ptr__->nsp_lifo;
  std::vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>::clear(this_00);
  uVar4 = IStreamer::Read<unsigned_int>(stream);
  for (lVar9 = 0; (ulong)uVar4 * 0x48 - lVar9 != 0; lVar9 = lVar9 + 0x48) {
    Namer::Namer((Namer *)local_98,local_48);
    std::vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>::
    emplace_back<LiteScript::Namer>(this_00,(Namer *)local_98);
    Namer::~Namer((Namer *)local_98);
    Namer::LoadIDs((Namer *)((((this_00->
                               super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>
                               )._M_impl.super__Vector_impl_data._M_start)->current).data +
                            lVar9 + -0x10),stream);
  }
  return __return_storage_ptr__;
}

Assistant:

LiteScript::State LiteScript::State::Load(std::istream &stream, Memory &memory) {
    State state(memory);
    state.instr_index = IStreamer::Read<unsigned int>(stream);
    state.line_num = IStreamer::Read<unsigned int>(stream);
    std::allocator<Variable> allocator;
    allocator.destroy(&state.nsp_global);
    allocator.construct(&state.nsp_global, memory.GetVariable(IStreamer::Read<unsigned int>(stream)));
    state.args_tmp.clear();
    for (unsigned int i = 0, sz_i = IStreamer::Read<unsigned int>(stream); i < sz_i; i++) {
        state.args_tmp.push_back(std::vector<Variable>());
        for (unsigned int j = 0, sz_j = IStreamer::Read<unsigned int>(stream); j < sz_j; j++)
            state.args_tmp[i].push_back(memory.GetVariable(IStreamer::Read<unsigned int>(stream)));
    }
    state.args_tmp.clear();
    for (unsigned int i = 0, sz_i = IStreamer::Read<unsigned int>(stream); i < sz_i; i++) {
        state.args_def.push_back(std::vector<Variable>());
        for (unsigned int j = 0, sz_j = IStreamer::Read<unsigned int>(stream); j < sz_j; j++)
            state.args_def[i].push_back(memory.GetVariable(IStreamer::Read<unsigned int>(stream)));
    }
    state.ths.clear();
    for (unsigned int i = 0, sz = IStreamer::Read<unsigned int>(stream); i < sz; i++) {
        if (stream.get() == 0)
            state.ths.push_back(Nullable<Variable>());
        else
            state.ths.push_back(Nullable<Variable>(memory.GetVariable(IStreamer::Read<unsigned int>(stream))));
    }
    state.rets.clear();
    for (unsigned int i = 0, sz = IStreamer::Read<unsigned int>(stream); i < sz; i++) {
        if (stream.get() == 0)
            state.rets.push_back(Nullable<Variable>());
        else
            state.rets.push_back(Nullable<Variable>(memory.GetVariable(IStreamer::Read<unsigned int>(stream))));
    }
    state.op_lifo.clear();
    for (unsigned int i = 0, sz = IStreamer::Read<unsigned int>(stream); i < sz; i++)
        state.op_lifo.push_back(memory.GetVariable(IStreamer::Read<unsigned int>(stream)));
    state.call_lifo.clear();
    for (unsigned int i = 0, sz = IStreamer::Read<unsigned int>(stream); i < sz; i++)
        state.call_lifo.push_back({ IStreamer::Read<unsigned int>(stream), IStreamer::Read<unsigned int>(stream) });
    state.nsp_lifo.clear();
    for (unsigned int i = 0, sz = IStreamer::Read<unsigned int>(stream); i < sz; i++) {
        state.nsp_lifo.push_back(Namer(state.nsp_global));
        state.nsp_lifo[i].LoadIDs(stream);
    }
    return state;
}